

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O1

void Clear(LinkedList *L)

{
  node *pnVar1;
  Node *ptr;
  
  ptr = L->front;
  while (ptr != (Node *)0x0) {
    pnVar1 = ptr->next;
    FreeNode(ptr);
    ptr = pnVar1;
  }
  L->prevPtr = (Node *)0x0;
  L->currPtr = (Node *)0x0;
  L->front = (Node *)0x0;
  L->rear = (Node *)0x0;
  L->size = 0;
  L->position = -1;
  return;
}

Assistant:

void Clear(LinkedList *L) {   //链表中清空链表的函数
    Node *currNode = L->front;
    Node *nextNode;
    while(currNode) {
        nextNode = currNode->next;  //保存后继结点指针
        FreeNode(currNode);  //释放当前结点
        currNode = nextNode;  //原后继结点成为当前结点
    }
    //修改空链表数据
    L->front = NULL;
    L->rear = NULL;
    L->prevPtr = NULL;
    L->currPtr = NULL;
    L->size = 0;
    L->position = -1;
}